

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall PluginFverb::run(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  pointer this_00;
  EVP_PKEY_CTX *ctx;
  uint local_38;
  uint32_t ch;
  DenormalDisabler local_28;
  uint32_t local_24;
  DenormalDisabler dd;
  uint32_t frames_local;
  float **outputs_local;
  float **inputs_local;
  PluginFverb *this_local;
  
  if (frames != 0) {
    ctx = (EVP_PKEY_CTX *)inputs;
    local_24 = frames;
    _dd = outputs;
    WebCore::DenormalDisabler::DenormalDisabler(&local_28);
    if (0.5 < this->fBypass || this->fBypass == 0.5) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        if (inputs[local_38] != _dd[local_38]) {
          std::copy_n<float_const*,unsigned_int,float*>(inputs[local_38],local_24,_dd[local_38]);
        }
      }
      this->fWasBypass = true;
    }
    else {
      if ((this->fWasBypass & 1U) != 0) {
        clear(this);
        this->fWasBypass = false;
      }
      if ((this->fVintage & 1U) != (this->fWasVintage & 1U)) {
        this_00 = std::unique_ptr<Fverb,_std::default_delete<Fverb>_>::operator->(&this->fDsp);
        if ((this->fVintage & 1U) == 0) {
          DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
        }
        Fverb::init(this_00,ctx);
        clear(this);
        this->fWasVintage = (bool)(this->fVintage & 1);
      }
      runSegmented(this,inputs,_dd,local_24);
    }
    WebCore::DenormalDisabler::~DenormalDisabler(&local_28);
  }
  return;
}

Assistant:

void PluginFverb::run(const float **inputs, float **outputs, uint32_t frames)
{
    if (frames < 1)
        return;

    WebCore::DenormalDisabler dd;

    if (fBypass < 0.5f) {
        // TODO make it smooth
        if (fWasBypass) {
            clear();
            fWasBypass = false;
        }
        if (fVintage != fWasVintage) {
            fDsp->init(fVintage ? kVintageSampleRate : getSampleRate());
            clear();
            fWasVintage = fVintage;
        }
        runSegmented(inputs, outputs, frames);
    }
    else {
        for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
            if (inputs[ch] != outputs[ch])
                std::copy_n(inputs[ch], frames, outputs[ch]);
        }
        fWasBypass = true;
    }
}